

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui-ws.cpp
# Opt level: O0

int __thiscall ImGuiWS::init(ImGuiWS *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  undefined8 uVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  string *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_R9;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  uint uVar3;
  string local_50 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_30;
  uint local_c;
  ImGuiWS *local_8;
  
  local_c = (uint)ctx;
  local_30 = in_R9;
  local_8 = this;
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d07be);
  std::function<void_()>::operator=
            ((function<void_()> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (function<void_()> *)this);
  std::unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_>::operator->
            ((unique_ptr<ImGuiWS::Impl,_std::default_delete<ImGuiWS::Impl>_> *)0x1d07e8);
  std::function<void_()>::operator=
            ((function<void_()> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
             (function<void_()> *)this);
  uVar3 = local_c;
  std::__cxx11::string::string(local_50,in_RDX);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(local_30,in_R8);
  iVar1 = init(this,(EVP_PKEY_CTX *)(ulong)uVar3);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(in_RCX);
  uVar2 = std::__cxx11::string::~string(local_50);
  return (uint)CONCAT71((int7)((ulong)uVar2 >> 8),(char)iVar1) & 0xffffff01;
}

Assistant:

bool ImGuiWS::init(int32_t port, std::string pathHttp, std::vector<std::string> resources, THandler && handlerConnect, THandler && handlerDisconnect) {
    m_impl->handlerConnect = std::move(handlerConnect);
    m_impl->handlerDisconnect = std::move(handlerDisconnect);

    return init(port, std::move(pathHttp), std::move(resources));
}